

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator.hpp
# Opt level: O2

void __thiscall boost::unit_test::decorator::collector::~collector(collector *this)

{
  std::_Destroy_aux<false>::__destroy<boost::shared_ptr<boost::unit_test::decorator::base>*>
            ((this->m_tu_decorators).
             super__Vector_base<boost::shared_ptr<boost::unit_test::decorator::base>,_std::allocator<boost::shared_ptr<boost::unit_test::decorator::base>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_tu_decorators).
             super__Vector_base<boost::shared_ptr<boost::unit_test::decorator::base>,_std::allocator<boost::shared_ptr<boost::unit_test::decorator::base>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::
  _Vector_base<boost::shared_ptr<boost::unit_test::decorator::base>,_std::allocator<boost::shared_ptr<boost::unit_test::decorator::base>_>_>
  ::~_Vector_base((_Vector_base<boost::shared_ptr<boost::unit_test::decorator::base>,_std::allocator<boost::shared_ptr<boost::unit_test::decorator::base>_>_>
                   *)this);
  return;
}

Assistant:

class BOOST_TEST_DECL collector : public singleton<collector> {
public:
    collector&              operator*( base const& d );

    void                    store_in( test_unit& tu );

    void                    reset();

private:
    BOOST_TEST_SINGLETON_CONS( collector )

    // Data members
    std::vector<base_ptr>   m_tu_decorators;
}